

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void lm_init(deflate_state *s)

{
  long in_RDI;
  
  *(ulong *)(in_RDI + 0x58) = (ulong)*(uint *)(in_RDI + 0x44) << 1;
  *(undefined2 *)(*(long *)(in_RDI + 0x68) + (ulong)(*(int *)(in_RDI + 0x74) - 1) * 2) = 0;
  memset(*(void **)(in_RDI + 0x68),0,(ulong)(*(int *)(in_RDI + 0x74) - 1) << 1);
  *(uint *)(in_RDI + 0xb0) = (uint)configuration_table[*(int *)(in_RDI + 0xb4)].max_lazy;
  *(uint *)(in_RDI + 0xbc) = (uint)configuration_table[*(int *)(in_RDI + 0xb4)].good_length;
  *(uint *)(in_RDI + 0xc0) = (uint)configuration_table[*(int *)(in_RDI + 0xb4)].nice_length;
  *(uint *)(in_RDI + 0xac) = (uint)configuration_table[*(int *)(in_RDI + 0xb4)].max_chain;
  *(undefined4 *)(in_RDI + 0x9c) = 0;
  *(undefined8 *)(in_RDI + 0x88) = 0;
  *(undefined4 *)(in_RDI + 0xa4) = 0;
  *(undefined4 *)(in_RDI + 0xa8) = 2;
  *(undefined4 *)(in_RDI + 0x90) = 2;
  *(undefined4 *)(in_RDI + 0x98) = 0;
  *(undefined4 *)(in_RDI + 0x70) = 0;
  return;
}

Assistant:

local void lm_init (s)
    deflate_state *s;
{
    s->window_size = (ulg)2L*s->w_size;

    CLEAR_HASH(s);

    /* Set the default configuration parameters:
     */
    s->max_lazy_match   = configuration_table[s->level].max_lazy;
    s->good_match       = configuration_table[s->level].good_length;
    s->nice_match       = configuration_table[s->level].nice_length;
    s->max_chain_length = configuration_table[s->level].max_chain;

    s->strstart = 0;
    s->block_start = 0L;
    s->lookahead = 0;
    s->match_length = s->prev_length = MIN_MATCH-1;
    s->match_available = 0;
    s->ins_h = 0;
#ifndef FASTEST
#ifdef ASMV
    match_init(); /* initialize the asm code */
#endif
#endif
}